

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O2

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadArenaString
          (EpsCopyInputStream *this,char *ptr,ArenaStringPtr *s,Arena *arena)

{
  uint32_t size;
  string *s_00;
  char *pcVar1;
  char *local_40;
  LogMessageFatal local_38 [16];
  
  local_40 = ptr;
  if (arena != (Arena *)0x0) {
    size = ReadSize(&local_40);
    if (local_40 == (char *)0x0) {
      pcVar1 = (char *)0x0;
    }
    else {
      s_00 = ArenaStringPtr::NewString<>(s,arena);
      pcVar1 = ReadString(this,local_40,size,s_00);
    }
    return pcVar1;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/arenastring.cc"
             ,0x10e,0x10,"arena != nullptr");
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_38);
}

Assistant:

const char* EpsCopyInputStream::ReadArenaString(const char* ptr,
                                                ArenaStringPtr* s,
                                                Arena* arena) {
  ScopedCheckPtrInvariants check(&s->tagged_ptr_);
  ABSL_DCHECK(arena != nullptr);

  int size = ReadSize(&ptr);
  if (!ptr) return nullptr;

  auto* str = s->NewString(arena);
  ptr = ReadString(ptr, size, str);
  GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
  return ptr;
}